

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall FastLinearExpert<1,_1>::modelDisplay(FastLinearExpert<1,_1> *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"Nu=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"invSigma=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).invSigma);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Mu=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Mu);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Lambda=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Lambda);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Psi=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Psi);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"H=\n");
  poVar1 = std::ostream::_M_insert<double>((this->super_LinearExpert<1,_1>).H);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"Sh=\n");
  poVar1 = std::ostream::_M_insert<double>((this->super_LinearExpert<1,_1>).Sh);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Sz=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Sz);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Sx=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Sx);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Sxz=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Sxz);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"invSzz=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &this->invSzz);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"invSzz0=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &this->invSzz0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"detInvSzz0=\n");
  poVar1 = std::ostream::_M_insert<double>(this->detInvSzz0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Sxx=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Sxx);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Nu0=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                    &(this->super_LinearExpert<1,_1>).Nu0);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::modelDisplay(std::ostream &out) const
{
    out << EXPAND_N(Nu) << std::endl;
    out << EXPAND_N(invSigma) << std::endl;
    out << EXPAND_N(Mu) << std::endl;
    out << EXPAND_N(Lambda) << std::endl;
    out << EXPAND_N(Psi) << std::endl;

    out << EXPAND_N(H) << std::endl;
    out << EXPAND_N(Sh) << std::endl;
    out << EXPAND_N(Sz) << std::endl;
    out << EXPAND_N(Sx) << std::endl;
    out << EXPAND_N(Sxz) << std::endl;
    out << EXPAND_N(invSzz) << std::endl;
    out << EXPAND_N(invSzz0) << std::endl;
    out << EXPAND_N(detInvSzz0) << std::endl;
    out << EXPAND_N(Sxx) << std::endl;
    out << EXPAND_N(Nu0) << std::endl;
//
//    out << EXPAND(wPsi) << std::endl;
//    out << EXPAND(wNu) << std::endl;
//    out << EXPAND(wSigma) << std::endl;
//    out << EXPAND(wLambda) << std::endl;
//    out << EXPAND(alpha) << std::endl;
//    out << EXPAND(mixture->getPsi()) << std::endl;
//    out << EXPAND(mixture->getSigma()) << std::endl;
}